

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O1

void C_AddTabCommand(char *name)

{
  bool bVar1;
  int pos;
  TabData tab;
  uint local_1c;
  TabData local_18;
  
  bVar1 = FindTabCommand(name,(int *)&local_1c,0x7fffffff);
  if (bVar1) {
    TabCommands.Array[(int)local_1c].UseCount = TabCommands.Array[(int)local_1c].UseCount + 1;
  }
  else {
    local_18.UseCount = 1;
    local_18.TabName.Index = FName::NameManager::FindName(&FName::NameData,name,false);
    TArray<TabData,_TabData>::Insert(&TabCommands,local_1c,&local_18);
  }
  return;
}

Assistant:

void C_AddTabCommand (const char *name)
{
	int pos;

	if (FindTabCommand (name, &pos, INT_MAX))
	{
		TabCommands[pos].UseCount++;
	}
	else
	{
		TabData tab(name);
		TabCommands.Insert (pos, tab);
	}
}